

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

_Bool is_event_equal_for_match(LIST_ITEM_HANDLE list_item,void *match_context)

{
  _Bool _Var1;
  IOTHUB_EVENT_CALLBACK *event_callback;
  void *match_context_local;
  LIST_ITEM_HANDLE list_item_local;
  
  event_callback = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(list_item);
  _Var1 = is_event_equal(event_callback,(char *)match_context);
  return _Var1;
}

Assistant:

static bool is_event_equal_for_match(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    return is_event_equal((IOTHUB_EVENT_CALLBACK*)singlylinkedlist_item_get_value(list_item), (const char*)match_context);
}